

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall
Transaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test::TestBody
          (Transaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test
           *this)

{
  ByteData *pBVar1;
  AssertHelperData *pAVar2;
  bool bVar3;
  undefined4 uVar4;
  char *pcVar5;
  _func_int *p_Var6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  Transaction tx;
  undefined1 local_280 [32];
  internal local_260 [8];
  _Alloc_hider local_258;
  AssertHelper local_250;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_248;
  AbstractTxInReference local_230;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1a0;
  Txid local_188 [2];
  undefined **local_148;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_140;
  undefined **local_128;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_120;
  undefined **local_108;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_100;
  undefined **local_e8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_e0;
  undefined **local_c8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_c0;
  undefined **local_a8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_a0;
  undefined **local_88;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_80;
  undefined **local_68;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_60;
  undefined **local_48;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_40;
  
  cfd::core::Transaction::Transaction((Transaction *)local_188,2,0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      local_280._0_8_ = (AssertHelperData *)(local_280 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_280,
                 "d4470b3c4b616042e5004b1ab60cb1734d21b8e1c4854c379ec8c3f7ca1e450f","");
      cfd::core::Txid::Txid((Txid *)&local_230,(string *)local_280);
      cfd::core::Transaction::AddTxIn(local_188,(uint)&local_230,0,(Script *)0xfffffffe);
      local_230._vptr_AbstractTxInReference = (_func_int **)&PTR__Txid_004ccb78;
      if (local_230.txid_._vptr_Txid != (_func_int **)0x0) {
        operator_delete(local_230.txid_._vptr_Txid);
      }
      if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)(local_280 + 0x10)) {
        operator_delete((void *)local_280._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x13e,
               "Expected: tx.AddTxIn( Txid( \"d4470b3c4b616042e5004b1ab60cb1734d21b8e1c4854c379ec8c3f7ca1e450f\"), 0, 4294967294) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pBVar1 = &local_230.txid_.data_;
      local_230._vptr_AbstractTxInReference = (_func_int **)pBVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"1122334455667788","");
      cfd::core::ByteData::ByteData((ByteData *)local_280,(string *)&local_230);
      cfd::core::Transaction::AddScriptWitnessStack((uint)&local_48,(ByteData *)local_188);
      local_48 = &PTR__ScriptWitness_004d2f88;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_40);
      if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_280._0_8_);
      }
      if ((ByteData *)local_230._vptr_AbstractTxInReference != pBVar1) {
        operator_delete(local_230._vptr_AbstractTxInReference);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x141,
               "Expected: tx.AddScriptWitnessStack(0, ByteData(\"1122334455667788\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pBVar1 = &local_230.txid_.data_;
      local_230._vptr_AbstractTxInReference = (_func_int **)pBVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"1122334455667788990011223344556677889900","");
      cfd::core::ByteData160::ByteData160((ByteData160 *)local_280,(string *)&local_230);
      cfd::core::Transaction::AddScriptWitnessStack((uint)&local_68,(ByteData160 *)local_188);
      local_68 = &PTR__ScriptWitness_004d2f88;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_60);
      if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_280._0_8_);
      }
      if ((ByteData *)local_230._vptr_AbstractTxInReference != pBVar1) {
        operator_delete(local_230._vptr_AbstractTxInReference);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x144,
               "Expected: tx.AddScriptWitnessStack( 0, ByteData160(\"1122334455667788990011223344556677889900\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pBVar1 = &local_230.txid_.data_;
      local_230._vptr_AbstractTxInReference = (_func_int **)pBVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,
                 "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385","");
      cfd::core::ByteData256::ByteData256((ByteData256 *)local_280,(string *)&local_230);
      cfd::core::Transaction::AddScriptWitnessStack((uint)&local_88,(ByteData256 *)local_188);
      local_88 = &PTR__ScriptWitness_004d2f88;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_80);
      if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_280._0_8_);
      }
      if ((ByteData *)local_230._vptr_AbstractTxInReference != pBVar1) {
        operator_delete(local_230._vptr_AbstractTxInReference);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x149,
               "Expected: tx.AddScriptWitnessStack( 0, ByteData256( \"90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    pBVar1 = &local_230.txid_.data_;
    local_230._vptr_AbstractTxInReference = (_func_int **)pBVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"aaaa","");
    cfd::core::ByteData::ByteData((ByteData *)local_280,(string *)&local_230);
    cfd::core::Transaction::AddScriptWitnessStack((uint)&local_a8,(ByteData *)local_188);
    local_a8 = &PTR__ScriptWitness_004d2f88;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_a0);
    if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
      operator_delete((void *)local_280._0_8_);
    }
    if ((ByteData *)local_230._vptr_AbstractTxInReference != pBVar1) {
      operator_delete(local_230._vptr_AbstractTxInReference);
    }
  }
  testing::Message::Message((Message *)&local_230);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_280,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x14a,
             "Expected: tx.AddScriptWitnessStack(3, ByteData(\"aaaa\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
  if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
      (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    local_230._vptr_AbstractTxInReference)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar4 = cfd::core::Transaction::GetScriptWitnessStackNum((uint)local_188);
  local_280._0_4_ = uVar4;
  local_250.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_230,"tx.GetScriptWitnessStackNum(0)","3",(uint *)local_280,
             (int *)&local_250);
  if ((char)local_230._vptr_AbstractTxInReference == '\0') {
    testing::Message::Message((Message *)local_280);
    if (local_230.txid_._vptr_Txid == (_func_int **)0x0) {
      p_Var6 = (_func_int *)0x43a303;
    }
    else {
      p_Var6 = *local_230.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x14c,(char *)p_Var6);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_280._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_230.txid_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::core::Transaction::GetTxIn((uint)&local_230);
  local_250.data_ = (AssertHelperData *)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_248,&local_230.script_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_260,"tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str()",
             "\"1122334455667788\"",(char *)local_280._0_8_,"1122334455667788");
  pAVar2 = (AssertHelperData *)(local_280 + 0x10);
  if ((AssertHelperData *)local_280._0_8_ != pAVar2) {
    operator_delete((void *)local_280._0_8_);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1a0);
  local_250.data_ = (AssertHelperData *)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_248);
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_230);
  if (local_260[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_230);
    if (local_258._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_258._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x14f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Transaction::GetTxIn((uint)&local_230);
  local_250.data_ = (AssertHelperData *)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_248,&local_230.script_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_260,"tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str()",
             "\"1122334455667788990011223344556677889900\"",(char *)local_280._0_8_,
             "1122334455667788990011223344556677889900");
  if ((AssertHelperData *)local_280._0_8_ != pAVar2) {
    operator_delete((void *)local_280._0_8_);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1a0);
  local_250.data_ = (AssertHelperData *)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_248);
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_230);
  if (local_260[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_230);
    if (local_258._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_258._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x152,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Transaction::GetTxIn((uint)&local_230);
  local_250.data_ = (AssertHelperData *)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_248,&local_230.script_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_260,"tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str()",
             "\"90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385\"",
             (char *)local_280._0_8_,
             "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385");
  if ((AssertHelperData *)local_280._0_8_ != pAVar2) {
    operator_delete((void *)local_280._0_8_);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1a0);
  local_250.data_ = (AssertHelperData *)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_248);
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_230);
  if (local_260[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_230);
    if (local_258._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_258._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x155,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pBVar1 = &local_230.txid_.data_;
      local_230._vptr_AbstractTxInReference = (_func_int **)pBVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"ffff","");
      cfd::core::ByteData::ByteData((ByteData *)local_280,(string *)&local_230);
      cfd::core::Transaction::SetScriptWitnessStack((uint)&local_c8,(uint)local_188,(ByteData *)0x0)
      ;
      local_c8 = &PTR__ScriptWitness_004d2f88;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_c0);
      if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_280._0_8_);
      }
      if ((ByteData *)local_230._vptr_AbstractTxInReference != pBVar1) {
        operator_delete(local_230._vptr_AbstractTxInReference);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x158,
               "Expected: tx.SetScriptWitnessStack(0, 0, ByteData(\"ffff\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pBVar1 = &local_230.txid_.data_;
      local_230._vptr_AbstractTxInReference = (_func_int **)pBVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"1111222233334444555566667777888899990000","");
      cfd::core::ByteData160::ByteData160((ByteData160 *)local_280,(string *)&local_230);
      cfd::core::Transaction::SetScriptWitnessStack
                ((uint)&local_e8,(uint)local_188,(ByteData160 *)0x0);
      local_e8 = &PTR__ScriptWitness_004d2f88;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_e0);
      if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_280._0_8_);
      }
      if ((ByteData *)local_230._vptr_AbstractTxInReference != pBVar1) {
        operator_delete(local_230._vptr_AbstractTxInReference);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x15b,
               "Expected: tx.SetScriptWitnessStack( 0, 1, ByteData160(\"1111222233334444555566667777888899990000\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pBVar1 = &local_230.txid_.data_;
      local_230._vptr_AbstractTxInReference = (_func_int **)pBVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,
                 "1111222233334444555566667777888899990000111122223333444455556666","");
      cfd::core::ByteData256::ByteData256((ByteData256 *)local_280,(string *)&local_230);
      cfd::core::Transaction::SetScriptWitnessStack
                ((uint)&local_108,(uint)local_188,(ByteData256 *)0x0);
      local_108 = &PTR__ScriptWitness_004d2f88;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_100);
      if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_280._0_8_);
      }
      if ((ByteData *)local_230._vptr_AbstractTxInReference != pBVar1) {
        operator_delete(local_230._vptr_AbstractTxInReference);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x161,
               "Expected: tx.SetScriptWitnessStack( 0, 2, ByteData256( \"1111222233334444555566667777888899990000111122223333444455556666\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    pBVar1 = &local_230.txid_.data_;
    local_230._vptr_AbstractTxInReference = (_func_int **)pBVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"aaaa","");
    cfd::core::ByteData::ByteData((ByteData *)local_280,(string *)&local_230);
    cfd::core::Transaction::SetScriptWitnessStack((uint)&local_128,(uint)local_188,(ByteData *)0x2);
    local_128 = &PTR__ScriptWitness_004d2f88;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_120);
    if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
      operator_delete((void *)local_280._0_8_);
    }
    if ((ByteData *)local_230._vptr_AbstractTxInReference != pBVar1) {
      operator_delete(local_230._vptr_AbstractTxInReference);
    }
  }
  testing::Message::Message((Message *)&local_230);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_280,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x162,
             "Expected: tx.SetScriptWitnessStack(2, 0, ByteData(\"aaaa\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
  if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
      (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    local_230._vptr_AbstractTxInReference)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    pBVar1 = &local_230.txid_.data_;
    local_230._vptr_AbstractTxInReference = (_func_int **)pBVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"bbbb","");
    cfd::core::ByteData::ByteData((ByteData *)local_280,(string *)&local_230);
    cfd::core::Transaction::SetScriptWitnessStack((uint)&local_148,(uint)local_188,(ByteData *)0x0);
    local_148 = &PTR__ScriptWitness_004d2f88;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_140);
    if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
      operator_delete((void *)local_280._0_8_);
    }
    if ((ByteData *)local_230._vptr_AbstractTxInReference != pBVar1) {
      operator_delete(local_230._vptr_AbstractTxInReference);
    }
  }
  testing::Message::Message((Message *)&local_230);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_280,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x163,
             "Expected: tx.SetScriptWitnessStack(0, 4, ByteData(\"bbbb\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
  if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
      (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    local_230._vptr_AbstractTxInReference)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar4 = cfd::core::Transaction::GetScriptWitnessStackNum((uint)local_188);
  local_280._0_4_ = uVar4;
  local_250.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_230,"tx.GetScriptWitnessStackNum(0)","3",(uint *)local_280,
             (int *)&local_250);
  if ((char)local_230._vptr_AbstractTxInReference == '\0') {
    testing::Message::Message((Message *)local_280);
    if (local_230.txid_._vptr_Txid == (_func_int **)0x0) {
      p_Var6 = (_func_int *)0x43a303;
    }
    else {
      p_Var6 = *local_230.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x165,(char *)p_Var6);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_280._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_230.txid_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::core::Transaction::GetTxIn((uint)&local_230);
  local_250.data_ = (AssertHelperData *)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_248,&local_230.script_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_260,"tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str()",
             "\"ffff\"",(char *)local_280._0_8_,"ffff");
  if ((AssertHelperData *)local_280._0_8_ != pAVar2) {
    operator_delete((void *)local_280._0_8_);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1a0);
  local_250.data_ = (AssertHelperData *)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_248);
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_230);
  if (local_260[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_230);
    if (local_258._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_258._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x168,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Transaction::GetTxIn((uint)&local_230);
  local_250.data_ = (AssertHelperData *)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_248,&local_230.script_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_260,"tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str()",
             "\"1111222233334444555566667777888899990000\"",(char *)local_280._0_8_,
             "1111222233334444555566667777888899990000");
  if ((AssertHelperData *)local_280._0_8_ != pAVar2) {
    operator_delete((void *)local_280._0_8_);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1a0);
  local_250.data_ = (AssertHelperData *)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_248);
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_230);
  if (local_260[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_230);
    if (local_258._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_258._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x16b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Transaction::GetTxIn((uint)&local_230);
  local_250.data_ = (AssertHelperData *)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_248,&local_230.script_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_260,"tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str()",
             "\"1111222233334444555566667777888899990000111122223333444455556666\"",
             (char *)local_280._0_8_,
             "1111222233334444555566667777888899990000111122223333444455556666");
  if ((AssertHelperData *)local_280._0_8_ != pAVar2) {
    operator_delete((void *)local_280._0_8_);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1a0);
  local_250.data_ = (AssertHelperData *)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_248);
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_230);
  if (local_260[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_230);
    if (local_258._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_258._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x16e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::Transaction::GetScriptWitnessStackNum((uint)local_188);
  local_280._0_4_ = uVar4;
  local_250.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_230,"tx.GetScriptWitnessStackNum(0)","3",(uint *)local_280,
             (int *)&local_250);
  if ((char)local_230._vptr_AbstractTxInReference == '\0') {
    testing::Message::Message((Message *)local_280);
    if (local_230.txid_._vptr_Txid == (_func_int **)0x0) {
      p_Var6 = (_func_int *)0x43a303;
    }
    else {
      p_Var6 = *local_230.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x171,(char *)p_Var6);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_280._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_230.txid_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::core::Transaction::RemoveScriptWitnessStackAll((uint)local_188);
  }
  testing::Message::Message((Message *)&local_230);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_280,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x172,
             "Expected: tx.RemoveScriptWitnessStackAll(3) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
  if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
      (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    local_230._vptr_AbstractTxInReference)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start + 8))();
    }
  }
  uVar4 = cfd::core::Transaction::GetScriptWitnessStackNum((uint)local_188);
  local_280._0_4_ = uVar4;
  local_250.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_230,"tx.GetScriptWitnessStackNum(0)","3",(uint *)local_280,
             (int *)&local_250);
  if ((char)local_230._vptr_AbstractTxInReference == '\0') {
    testing::Message::Message((Message *)local_280);
    if (local_230.txid_._vptr_Txid == (_func_int **)0x0) {
      p_Var6 = (_func_int *)0x43a303;
    }
    else {
      p_Var6 = *local_230.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x173,(char *)p_Var6);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_280._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_230.txid_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::Transaction::RemoveScriptWitnessStackAll((uint)local_188);
    }
  }
  else {
    testing::Message::Message((Message *)&local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x175,
               "Expected: tx.RemoveScriptWitnessStackAll(0) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_280,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_280);
    if ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((ByteData *)local_230._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_230._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  uVar4 = cfd::core::Transaction::GetScriptWitnessStackNum((uint)local_188);
  local_280._0_4_ = uVar4;
  local_250.data_ = local_250.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_230,"tx.GetScriptWitnessStackNum(0)","0",(uint *)local_280,
             (int *)&local_250);
  if ((char)local_230._vptr_AbstractTxInReference == '\0') {
    testing::Message::Message((Message *)local_280);
    if (local_230.txid_._vptr_Txid == (_func_int **)0x0) {
      p_Var6 = (_func_int *)0x43a303;
    }
    else {
      p_Var6 = *local_230.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x176,(char *)p_Var6);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_280._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_280._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_230.txid_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::core::Transaction::~Transaction((Transaction *)local_188);
  return;
}

Assistant:

TEST(Transaction, AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll) {
  Transaction tx(exp_version, exp_locktime);
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "d4470b3c4b616042e5004b1ab60cb1734d21b8e1c4854c379ec8c3f7ca1e450f"),
          0, 4294967294));

  // AddScriptWitnessStack
  EXPECT_NO_THROW(tx.AddScriptWitnessStack(0, ByteData("1122334455667788")));
  EXPECT_NO_THROW(
      tx.AddScriptWitnessStack(
          0, ByteData160("1122334455667788990011223344556677889900")));
  EXPECT_NO_THROW(
      tx.AddScriptWitnessStack(
          0,
          ByteData256(
              "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385")));
  EXPECT_THROW(tx.AddScriptWitnessStack(3, ByteData("aaaa")), CfdException);

  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "1122334455667788");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str(),
      "1122334455667788990011223344556677889900");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str(),
      "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385");

  // SetScriptWitnessStack
  EXPECT_NO_THROW(tx.SetScriptWitnessStack(0, 0, ByteData("ffff")));
  EXPECT_NO_THROW(
      tx.SetScriptWitnessStack(
          0, 1, ByteData160("1111222233334444555566667777888899990000")));
  EXPECT_NO_THROW(
      tx.SetScriptWitnessStack(
          0,
          2,
          ByteData256(
              "1111222233334444555566667777888899990000111122223333444455556666")));
  EXPECT_THROW(tx.SetScriptWitnessStack(2, 0, ByteData("aaaa")), CfdException);
  EXPECT_THROW(tx.SetScriptWitnessStack(0, 4, ByteData("bbbb")), CfdException);

  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "ffff");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str(),
      "1111222233334444555566667777888899990000");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str(),
      "1111222233334444555566667777888899990000111122223333444455556666");

  // RemoveScriptWitnessStackAll
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);
  EXPECT_THROW(tx.RemoveScriptWitnessStackAll(3), CfdException);
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);

  EXPECT_NO_THROW(tx.RemoveScriptWitnessStackAll(0));
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 0);
}